

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetRuntimeDllsNode::Evaluate
          (string *__return_storage_ptr__,TargetRuntimeDllsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *psVar1;
  pointer ppcVar2;
  TargetType TVar3;
  cmGeneratorTarget *this_00;
  cmComputeLinkInformation *pcVar4;
  ostream *poVar5;
  pointer ppcVar6;
  string_view separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dllPaths;
  ostringstream e;
  string local_1f8;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [32];
  char local_188;
  ios_base local_138 [264];
  
  psVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,psVar1);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Objects of target \"",0x13);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\" referenced but no such target exists.",0x27);
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1f8,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_1f8,&local_1d0);
  }
  else {
    TVar3 = cmGeneratorTarget::GetType(this_00);
    if ((TVar3 < OBJECT_LIBRARY) && (TVar3 != STATIC_LIBRARY)) {
      pcVar4 = cmGeneratorTarget::GetLinkInformation(this_00,&context->Config);
      if (pcVar4 != (cmComputeLinkInformation *)0x0) {
        local_1f8._M_dataplus._M_p = (pointer)0x0;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_allocated_capacity = 0;
        ppcVar6 = (pcVar4->RuntimeDLLs).
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppcVar2 = (pcVar4->RuntimeDLLs).
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_1b0 = __return_storage_ptr__;
        if (ppcVar6 != ppcVar2) {
          do {
            cmGeneratorTarget::MaybeGetLocation
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1a8,*ppcVar6,&context->Config);
            if (local_188 == '\x01') {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_1f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8);
            }
            if ((local_188 == '\x01') &&
               (local_188 = '\0', (undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10)) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            ppcVar6 = ppcVar6 + 1;
          } while (ppcVar6 != ppcVar2);
        }
        psVar1 = local_1b0;
        separator._M_str = ";";
        separator._M_len = 1;
        cmJoin(local_1b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1f8,separator,(string_view)ZEXT816(0));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1f8);
        return psVar1;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Objects of target \"",0x13);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\" referenced but is not one of the allowed target types ",0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(EXECUTABLE, SHARED, MODULE).",0x1d);
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1f8,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_1f8,&local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string const& tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not one of the allowed target types "
        << "(EXECUTABLE, SHARED, MODULE).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }

    if (auto* cli = gt->GetLinkInformation(context->Config)) {
      std::vector<std::string> dllPaths;
      auto const& dlls = cli->GetRuntimeDLLs();

      for (auto const& dll : dlls) {
        if (auto loc = dll->MaybeGetLocation(context->Config)) {
          dllPaths.emplace_back(*loc);
        }
      }

      return cmJoin(dllPaths, ";");
    }

    return "";
  }